

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O1

void __thiscall llvm::APInt::APInt(APInt *this,APInt *that)

{
  uint uVar1;
  uint64_t *__dest;
  ulong __n;
  
  uVar1 = that->BitWidth;
  this->BitWidth = uVar1;
  if ((ulong)uVar1 < 0x41) {
    this->U = that->U;
    return;
  }
  __n = (ulong)((uint)((ulong)uVar1 + 0x3f >> 3) & 0xfffffff8);
  __dest = (uint64_t *)operator_new__(__n);
  (this->U).pVal = __dest;
  memcpy(__dest,(that->U).pVal,__n);
  return;
}

Assistant:

APInt(const APInt &that) : BitWidth(that.BitWidth) {
    if (isSingleWord())
      U.VAL = that.U.VAL;
    else
      initSlowCase(that);
  }